

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skynet_server.c
# Opt level: O3

void skynet_globalinit(void)

{
  int iVar1;
  int iVar2;
  
  G_NODE.total = 0;
  G_NODE.init = 1;
  G_NODE.monitor_exit = 0;
  iVar2 = 0x164804;
  iVar1 = pthread_key_create(&G_NODE.handle_key,(__destr_function *)0x0);
  if (iVar1 == 0) {
    pthread_setspecific(G_NODE.handle_key,(void *)0xffffffff);
    return;
  }
  skynet_globalinit_cold_1();
  pthread_setspecific(G_NODE.handle_key,(void *)(ulong)(uint)-iVar2);
  return;
}

Assistant:

void 
skynet_globalinit(void) {
	G_NODE.total = 0;
	G_NODE.monitor_exit = 0;
	G_NODE.init = 1;
	if (pthread_key_create(&G_NODE.handle_key, NULL)) {
		fprintf(stderr, "pthread_key_create failed");
		exit(1);
	}
	// set mainthread's key
	skynet_initthread(THREAD_MAIN);
}